

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O1

Ray * __thiscall
pbrt::Transform::ApplyInverse(Ray *__return_storage_ptr__,Transform *this,Ray *r,Float *tMax)

{
  float fVar1;
  Float FVar2;
  undefined8 uVar3;
  uintptr_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  Point3fi o;
  Point3fi local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  Interval<float> local_38;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  fVar16 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar8._4_4_ = fVar16;
  auVar8._0_4_ = fVar16;
  auVar8._8_4_ = fVar16;
  auVar8._12_4_ = fVar16;
  fVar16 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar7._4_4_ = fVar16;
  auVar7._0_4_ = fVar16;
  auVar7._8_4_ = fVar16;
  auVar7._12_4_ = fVar16;
  local_48 = vmovlhps_avx(auVar8,auVar7);
  fVar16 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar13._4_4_ = fVar16;
  auVar13._0_4_ = fVar16;
  auVar13._8_4_ = fVar16;
  auVar13._12_4_ = fVar16;
  local_38 = (Interval<float>)vmovlps_avx(auVar13);
  ApplyInverse(&local_b8,this,(Point3fi *)local_48);
  fVar16 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar17 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar1 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * (this->mInv).m[0][1])),ZEXT416((uint)fVar16),
                           ZEXT416((uint)(this->mInv).m[0][0]));
  local_68 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),ZEXT416((uint)(this->mInv).m[0][2]));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * (this->mInv).m[1][1])),ZEXT416((uint)fVar16),
                           ZEXT416((uint)(this->mInv).m[1][0]));
  local_78 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),ZEXT416((uint)(this->mInv).m[1][2]));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * (this->mInv).m[2][1])),ZEXT416((uint)fVar16),
                           ZEXT416((uint)(this->mInv).m[2][0]));
  local_58 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),ZEXT416((uint)(this->mInv).m[2][2]));
  fVar16 = local_58._0_4_;
  fVar17 = local_78._0_4_;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar17)),local_68,local_68);
  auVar8 = vfmadd231ss_fma(auVar8,local_58,local_58);
  if (0.0 < auVar8._0_4_) {
    auVar15._8_4_ = 0x7fffffff;
    auVar15._0_8_ = 0x7fffffff7fffffff;
    auVar15._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx(local_68,auVar15);
    auVar13 = vandps_avx(local_78,auVar15);
    auVar15 = vandps_avx(local_58,auVar15);
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ *
                                           (local_b8.super_Point3<pbrt::Interval<float>_>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                            high - local_b8.super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 0.5)),
                             ZEXT416((uint)((local_b8.super_Point3<pbrt::Interval<float>_>.
                                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
                                             high - local_b8.super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low) * 0.5)),auVar7);
    auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)((local_b8.super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .z.high - local_b8.
                                                  super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .z.low) * 0.5)),auVar15);
    fVar12 = auVar7._0_4_ / auVar8._0_4_;
    fVar1 = local_68._0_4_ * fVar12;
    local_98 = ZEXT416((uint)(fVar17 * fVar12));
    local_88 = ZEXT416((uint)(fVar16 * fVar12));
    i.high = fVar1;
    i.low = fVar1;
    auVar9._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_b8,i);
    auVar9._8_56_ = extraout_var;
    uVar3 = vmovlps_avx(auVar9._0_16_);
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.low = (float)uVar3;
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.high = (float)((ulong)uVar3 >> 0x20);
    i_00.high = (float)local_98._0_4_;
    i_00.low = (float)local_98._0_4_;
    auVar10._0_8_ =
         Interval<float>::operator+<float>
                   (&local_b8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
    auVar10._8_56_ = extraout_var_00;
    uVar3 = vmovlps_avx(auVar10._0_16_);
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.low = (float)uVar3;
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.high = (float)((ulong)uVar3 >> 0x20);
    i_01.high = (float)local_88._0_4_;
    i_01.low = (float)local_88._0_4_;
    auVar11._0_8_ =
         Interval<float>::operator+<float>
                   (&local_b8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
    auVar11._8_56_ = extraout_var_01;
    fVar16 = local_58._0_4_;
    local_b8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .z = (Interval<float>)vmovlps_avx(auVar11._0_16_);
    if (tMax != (Float *)0x0) {
      *tMax = *tMax - fVar12;
    }
  }
  auVar8 = vinsertps_avx(local_68,local_78,0x10);
  auVar6._4_4_ = local_b8.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar6._0_4_ = local_b8.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar6._8_4_ = local_b8.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar6._12_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  FVar2 = r->time;
  uVar4 = (r->medium).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  auVar7 = vinsertps_avx(auVar6,ZEXT416((uint)local_b8.super_Point3<pbrt::Interval<float>_>.
                                              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                              high),0x10);
  auVar14._0_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar7._0_4_;
  auVar14._4_4_ =
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar7._4_4_;
  auVar14._8_4_ = auVar7._8_4_ + 0.0;
  auVar14._12_4_ = auVar7._12_4_ + 0.0;
  auVar5._8_4_ = 0x3f000000;
  auVar5._0_8_ = 0x3f0000003f000000;
  auVar5._12_4_ = 0x3f000000;
  auVar7 = vmulps_avx512vl(auVar14,auVar5);
  uVar3 = vmovlps_avx(auVar7);
  (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
  (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar3 >> 0x20);
  (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.z =
       (local_b8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
       local_b8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  uVar3 = vmovlps_avx(auVar8);
  (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar3 >> 0x20);
  (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.z = fVar16;
  __return_storage_ptr__->time = FVar2;
  (__return_storage_ptr__->medium).
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar4;
  return __return_storage_ptr__;
}

Assistant:

inline Ray Transform::ApplyInverse(const Ray &r, Float *tMax) const {
    Point3fi o = ApplyInverse(Point3fi(r.o));
    Vector3f d = ApplyInverse(r.d);
    // Offset ray origin to edge of error bounds and compute _tMax_
    Float lengthSquared = LengthSquared(d);
    if (lengthSquared > 0) {
        Vector3f oError(o.x.Width() / 2, o.y.Width() / 2, o.z.Width() / 2);
        Float dt = Dot(Abs(d), oError) / lengthSquared;
        o += d * dt;
        if (tMax)
            *tMax -= dt;
    }
    return Ray(Point3f(o), d, r.time, r.medium);
}